

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

int statecmp(config *a,config *b)

{
  bool bVar1;
  int rc;
  config *b_local;
  config *a_local;
  
  rc = 0;
  b_local = b;
  a_local = a;
  while( true ) {
    bVar1 = false;
    if ((rc == 0) && (bVar1 = false, a_local != (config *)0x0)) {
      bVar1 = b_local != (config *)0x0;
    }
    if (!bVar1) break;
    rc = a_local->rp->index - b_local->rp->index;
    if (rc == 0) {
      rc = a_local->dot - b_local->dot;
    }
    a_local = a_local->bp;
    b_local = b_local->bp;
  }
  if (rc == 0) {
    if (a_local != (config *)0x0) {
      rc = 1;
    }
    if (b_local != (config *)0x0) {
      rc = -1;
    }
  }
  return rc;
}

Assistant:

PRIVATE int statecmp(struct config *a, struct config *b)
{
  int rc;
  for(rc=0; rc==0 && a && b;  a=a->bp, b=b->bp){
    rc = a->rp->index - b->rp->index;
    if( rc==0 ) rc = a->dot - b->dot;
  }
  if( rc==0 ){
    if( a ) rc = 1;
    if( b ) rc = -1;
  }
  return rc;
}